

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_compression.cpp
# Opt level: O1

void duckdb::DictionaryCompressionStorage::StringScanPartial<true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  CompressedStringScanState *this;
  idx_t start;
  
  this = (CompressedStringScanState *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  start = state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  if ((start & 0x1f) == 0 && scan_count == 0x800) {
    CompressedStringScanState::ScanToDictionaryVector(this,segment,result,result_offset,start,0x800)
    ;
    return;
  }
  CompressedStringScanState::ScanToFlatVector(this,result,result_offset,start,scan_count);
  return;
}

Assistant:

void DictionaryCompressionStorage::StringScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count,
                                                     Vector &result, idx_t result_offset) {
	// clear any previously locked buffers and get the primary buffer handle
	auto &scan_state = state.scan_state->Cast<CompressedStringScanState>();

	auto start = segment.GetRelativeIndex(state.row_index);
	if (!ALLOW_DICT_VECTORS || scan_count != STANDARD_VECTOR_SIZE ||
	    start % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE != 0) {
		scan_state.ScanToFlatVector(result, result_offset, start, scan_count);
	} else {
		scan_state.ScanToDictionaryVector(segment, result, result_offset, start, scan_count);
	}
}